

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.hpp
# Opt level: O2

void __thiscall
duckdb::RegexLocalState::RegexLocalState
          (RegexLocalState *this,RegexpBaseBindData *info,bool extract_all)

{
  int val;
  unsigned_long size;
  InvalidInputException *this_00;
  StringPiece local_40;
  
  (this->super_FunctionLocalState)._vptr_FunctionLocalState =
       (_func_int **)&PTR__RegexLocalState_02794988;
  local_40.data_ = (info->constant_string)._M_dataplus._M_p;
  local_40.size_ = (info->constant_string)._M_string_length;
  duckdb_re2::RE2::RE2(&this->constant_pattern,&local_40,&info->options);
  (this->group_buffer).group_buffer = (StringPiece *)0x0;
  (this->group_buffer).size = 0;
  (this->group_buffer).capacity = 0;
  if ((*(uint *)&(this->constant_pattern).field_0x44 & 0x1fffffff) == 0) {
    if ((extract_all) && (val = (this->constant_pattern).num_captures_, val != -1)) {
      size = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
      RegexStringPieceArgs::Init(&this->group_buffer,size);
    }
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this_00,(string *)(this->constant_pattern).error_);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

explicit RegexLocalState(RegexpBaseBindData &info, bool extract_all = false)
	    : constant_pattern(duckdb_re2::StringPiece(info.constant_string.c_str(), info.constant_string.size()),
	                       info.options) {
		if (!constant_pattern.ok()) {
			throw InvalidInputException(constant_pattern.error());
		}
		if (extract_all) {
			auto group_count_p = constant_pattern.NumberOfCapturingGroups();
			if (group_count_p != -1) {
				group_buffer.Init(NumericCast<idx_t>(group_count_p));
			}
		}
		D_ASSERT(info.constant_pattern);
	}